

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture1.c
# Opt level: O2

ktx_error_code_e
ktxTexture1_Create(ktxTextureCreateInfo *createInfo,ktxTextureCreateStorageEnum storageAllocation,
                  ktxTexture1 **newTex)

{
  GLenum internalFormat;
  ktx_uint32_t kVar1;
  ktx_error_code_e kVar2;
  ktxTexture1 *This;
  ktx_size_t __size;
  ktx_uint8_t *pkVar3;
  ktx_uint32_t kVar4;
  ktx_uint32_t kVar5;
  ulong uVar6;
  ktx_uint32_t local_54;
  ktxFormatSize local_50;
  
  if (newTex == (ktxTexture1 **)0x0) {
    return KTX_INVALID_VALUE;
  }
  This = (ktxTexture1 *)calloc(1,0x90);
  if (This == (ktxTexture1 *)0x0) {
    return KTX_OUT_OF_MEMORY;
  }
  internalFormat = createInfo->glInternalformat;
  This->glInternalformat = internalFormat;
  glGetFormatSize(internalFormat,&local_50);
  if (local_50.blockSizeInBits == 0) {
    kVar2 = KTX_UNSUPPORTED_TEXTURE_TYPE;
    goto switchD_001fa698_caseD_8d8a;
  }
  kVar2 = KTX_INVALID_VALUE;
  switch(internalFormat) {
  case 0x93b0:
  case 0x93b1:
  case 0x93b2:
  case 0x93b3:
  case 0x93b4:
  case 0x93b5:
  case 0x93b6:
  case 0x93b7:
  case 0x93b8:
  case 0x93b9:
  case 0x93ba:
  case 0x93bb:
  case 0x93bc:
  case 0x93bd:
  case 0x93c0:
  case 0x93c1:
  case 0x93c2:
  case 0x93c3:
  case 0x93c4:
  case 0x93c5:
  case 0x93c6:
  case 0x93c7:
  case 0x93c8:
  case 0x93c9:
  case 0x93d0:
  case 0x93d1:
  case 0x93d2:
  case 0x93d3:
  case 0x93d4:
  case 0x93d5:
  case 0x93d6:
  case 0x93d7:
  case 0x93d8:
  case 0x93d9:
  case 0x93da:
  case 0x93db:
  case 0x93dc:
  case 0x93dd:
  case 0x93e0:
  case 0x93e1:
  case 0x93e2:
  case 0x93e3:
  case 0x93e4:
  case 0x93e5:
  case 0x93e6:
  case 0x93e7:
  case 0x93e8:
  case 0x93e9:
  case 0x93f0:
  case 0x93f1:
    goto switchD_001fa702_caseD_8e8c;
  case 0x93be:
  case 0x93bf:
  case 0x93ca:
  case 0x93cb:
  case 0x93cc:
  case 0x93cd:
  case 0x93ce:
  case 0x93cf:
  case 0x93de:
  case 0x93df:
  case 0x93ea:
  case 0x93eb:
  case 0x93ec:
  case 0x93ed:
  case 0x93ee:
  case 0x93ef:
    goto switchD_001fa698_caseD_8d8a;
  }
  local_54 = 0x1903;
  switch(internalFormat) {
  case 0x8229:
  case 0x822a:
  case 0x822d:
  case 0x822e:
  case 0x8231:
  case 0x8232:
  case 0x8233:
  case 0x8234:
  case 0x8235:
  case 0x8236:
    goto switchD_001fa65b_caseD_8f94;
  case 0x822b:
  case 0x822c:
  case 0x822f:
  case 0x8230:
  case 0x8237:
  case 0x8238:
  case 0x8239:
  case 0x823a:
  case 0x823b:
  case 0x823c:
    goto switchD_001fa65b_caseD_8f95;
  }
  switch(internalFormat) {
  case 0x804f:
  case 0x8050:
  case 0x8051:
  case 0x8052:
  case 0x8053:
  case 0x8054:
switchD_001fa702_caseD_8e8e:
    local_54 = 0x1907;
    goto switchD_001fa65b_caseD_8f94;
  case 0x8055:
  case 0x8056:
  case 0x8057:
  case 0x8058:
  case 0x8059:
  case 0x805a:
  case 0x805b:
    goto switchD_001fa702_caseD_8e8c;
  default:
    switch(internalFormat) {
    case 0x8b90:
    case 0x8b92:
    case 0x8b95:
    case 0x8b97:
      goto switchD_001fa702_caseD_8e8e;
    case 0x8b91:
    case 0x8b93:
    case 0x8b94:
    case 0x8b96:
    case 0x8b98:
    case 0x8b99:
      goto switchD_001fa702_caseD_8e8c;
    }
  }
  local_54 = 0x1903;
  switch(internalFormat) {
  case 0x9270:
  case 0x9271:
    break;
  case 0x9272:
  case 0x9273:
switchD_001fa65b_caseD_8f95:
    local_54 = 0x8227;
    break;
  case 0x9274:
  case 0x9275:
    goto switchD_001fa702_caseD_8e8e;
  case 0x9276:
  case 0x9277:
  case 0x9278:
  case 0x9279:
switchD_001fa702_caseD_8e8c:
    local_54 = 0x1908;
    break;
  default:
    switch(internalFormat) {
    case 0x8d70:
    case 0x8d76:
    case 0x8d7c:
    case 0x8d82:
      goto switchD_001fa702_caseD_8e8c;
    case 0x8d71:
    case 0x8d77:
    case 0x8d7d:
    case 0x8d83:
      goto switchD_001fa702_caseD_8e8e;
    case 0x8d72:
    case 0x8d73:
    case 0x8d74:
    case 0x8d75:
    case 0x8d78:
    case 0x8d79:
    case 0x8d7a:
    case 0x8d7b:
    case 0x8d7e:
    case 0x8d7f:
    case 0x8d80:
    case 0x8d81:
      goto switchD_001fa698_caseD_8d8a;
    default:
      local_54 = 0x1903;
      switch(internalFormat) {
      case 0x8f94:
      case 0x8f98:
        break;
      case 0x8f95:
      case 0x8f99:
        goto switchD_001fa65b_caseD_8f95;
      case 0x8f96:
      case 0x8f9a:
        goto switchD_001fa702_caseD_8e8e;
      case 0x8f97:
      case 0x8f9b:
        goto switchD_001fa702_caseD_8e8c;
      default:
        switch(internalFormat) {
        case 0x83f0:
          goto switchD_001fa702_caseD_8e8e;
        case 0x83f1:
        case 0x83f2:
        case 0x83f3:
          goto switchD_001fa702_caseD_8e8c;
        default:
          switch(internalFormat) {
          case 0x8814:
          case 0x881a:
            goto switchD_001fa702_caseD_8e8c;
          case 0x8815:
          case 0x881b:
            goto switchD_001fa702_caseD_8e8e;
          case 0x8816:
          case 0x8817:
          case 0x8818:
          case 0x8819:
            goto switchD_001fa698_caseD_8d8a;
          default:
            switch(internalFormat) {
            case 0x8a54:
            case 0x8a55:
              goto switchD_001fa702_caseD_8e8e;
            case 0x8a56:
            case 0x8a57:
              goto switchD_001fa702_caseD_8e8c;
            default:
              switch(internalFormat) {
              case 0x8c00:
              case 0x8c01:
                goto switchD_001fa702_caseD_8e8e;
              case 0x8c02:
              case 0x8c03:
                goto switchD_001fa702_caseD_8e8c;
              default:
                switch(internalFormat) {
                case 0x8c3a:
                case 0x8c3d:
                case 0x8c41:
                  goto switchD_001fa702_caseD_8e8e;
                case 0x8c3b:
                case 0x8c3c:
                case 0x8c3e:
                case 0x8c3f:
                case 0x8c40:
                case 0x8c42:
                  goto switchD_001fa698_caseD_8d8a;
                case 0x8c43:
                  goto switchD_001fa702_caseD_8e8c;
                default:
                  switch(internalFormat) {
                  case 0x8c4c:
                    goto switchD_001fa702_caseD_8e8e;
                  case 0x8c4d:
                  case 0x8c4e:
                  case 0x8c4f:
                    goto switchD_001fa702_caseD_8e8c;
                  default:
                    switch(internalFormat) {
                    case 0x8d46:
                    case 0x8d47:
                    case 0x8d48:
                    case 0x8d49:
                      local_54 = 0x1901;
                      goto switchD_001fa65b_caseD_8f94;
                    }
                    switch(internalFormat) {
                    case 0x8d88:
                    case 0x8d8e:
                      goto switchD_001fa702_caseD_8e8c;
                    case 0x8d89:
                    case 0x8d8f:
                      goto switchD_001fa702_caseD_8e8e;
                    case 0x8d8a:
                    case 0x8d8b:
                    case 0x8d8c:
                    case 0x8d8d:
                      goto switchD_001fa698_caseD_8d8a;
                    default:
                      switch(internalFormat) {
                      case 0x8e8c:
                      case 0x8e8d:
                        goto switchD_001fa702_caseD_8e8c;
                      case 0x8e8e:
                      case 0x8e8f:
                        goto switchD_001fa702_caseD_8e8e;
                      default:
                        local_54 = 0x1903;
                        if ((1 < internalFormat - 0x8c70) && (1 < internalFormat - 0x8dbb)) {
                          if (internalFormat == 0x2a10) goto switchD_001fa702_caseD_8e8e;
                          if (((internalFormat == 0x81a5) || (internalFormat == 0x81a6)) ||
                             (internalFormat == 0x81a7)) goto LAB_001fa65d;
                          if (internalFormat == 0x87ee) goto switchD_001fa702_caseD_8e8c;
                          if (internalFormat == 0x88f0) goto LAB_001fa9ca;
                          if ((internalFormat == 0x8c72) || (internalFormat == 0x8c73))
                          goto switchD_001fa65b_caseD_8f95;
                          if (internalFormat == 0x8c92) goto switchD_001fa702_caseD_8e8e;
                          if (internalFormat == 0x8c93) goto switchD_001fa702_caseD_8e8c;
                          if (internalFormat == 0x8cac) {
LAB_001fa65d:
                            local_54 = 0x1902;
                          }
                          else {
                            if (internalFormat != 0x8cad) {
                              if ((internalFormat == 0x8d62) || (internalFormat == 0x8d64))
                              goto switchD_001fa702_caseD_8e8e;
                              if (internalFormat == 0x8dab) goto LAB_001fa65d;
                              if (internalFormat != 0x8dac) {
                                if ((internalFormat != 0x8dbd) && (internalFormat != 0x8dbe)) {
                                  if (internalFormat == 0x8fbd) break;
                                  if (internalFormat != 0x8fbe) {
                                    if (((internalFormat != 0x906f) && (internalFormat != 0x9137))
                                       && (internalFormat != 0x9138))
                                    goto switchD_001fa698_caseD_8d8a;
                                    goto switchD_001fa702_caseD_8e8c;
                                  }
                                }
                                goto switchD_001fa65b_caseD_8f95;
                              }
                            }
LAB_001fa9ca:
                            local_54 = 0x84f9;
                          }
                        }
                        break;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
switchD_001fa65b_caseD_8f94:
  kVar2 = ktxTexture_construct((ktxTexture *)This,createInfo,&local_50);
  if ((kVar2 == KTX_SUCCESS) && (kVar2 = ktxTexture1_constructCommon(This), kVar2 == KTX_SUCCESS)) {
    This->isCompressed = SUB41((local_50.flags & 2) >> 1,0);
    kVar4 = 1;
    if ((local_50.flags & 2) != 0) {
      This->glFormat = 0;
      This->glBaseInternalformat = local_54;
      kVar5 = 0;
      goto switchD_001faac4_caseD_8c41;
    }
    This->glFormat = local_54;
    This->glBaseInternalformat = local_54;
    kVar1 = createInfo->glInternalformat;
    kVar5 = 0x1401;
    switch(kVar1) {
    case 0x93b0:
    case 0x93b1:
    case 0x93b2:
    case 0x93b3:
    case 0x93b4:
    case 0x93b5:
    case 0x93b6:
    case 0x93b7:
    case 0x93b8:
    case 0x93b9:
    case 0x93ba:
    case 0x93bb:
    case 0x93bc:
    case 0x93bd:
    case 0x93c0:
    case 0x93c1:
    case 0x93c2:
    case 0x93c3:
    case 0x93c4:
    case 0x93c5:
    case 0x93c6:
    case 0x93c7:
    case 0x93c8:
    case 0x93c9:
    case 0x93d0:
    case 0x93d1:
    case 0x93d2:
    case 0x93d3:
    case 0x93d4:
    case 0x93d5:
    case 0x93d6:
    case 0x93d7:
    case 0x93d8:
    case 0x93d9:
    case 0x93da:
    case 0x93db:
    case 0x93dc:
    case 0x93dd:
    case 0x93e0:
    case 0x93e1:
    case 0x93e2:
    case 0x93e3:
    case 0x93e4:
    case 0x93e5:
    case 0x93e6:
    case 0x93e7:
    case 0x93e8:
    case 0x93e9:
    case 0x93f0:
    case 0x93f1:
      goto switchD_001faac4_caseD_8c41;
    case 0x93be:
    case 0x93bf:
    case 0x93ca:
    case 0x93cb:
    case 0x93cc:
    case 0x93cd:
    case 0x93ce:
    case 0x93cf:
    case 0x93de:
    case 0x93df:
    case 0x93ea:
    case 0x93eb:
    case 0x93ec:
    case 0x93ed:
    case 0x93ee:
    case 0x93ef:
      goto switchD_001faae1_caseD_8d8a;
    }
    switch(kVar1) {
    case 0x8229:
    case 0x822b:
    case 0x8232:
    case 0x8238:
      break;
    case 0x822a:
    case 0x822c:
    case 0x8234:
    case 0x823a:
switchD_001faa2f_caseD_8d76:
      kVar4 = 2;
      kVar5 = 0x1403;
      break;
    case 0x822d:
    case 0x822f:
switchD_001faaa7_caseD_881a:
      kVar4 = 2;
      kVar5 = 0x140b;
      break;
    case 0x822e:
    case 0x8230:
switchD_001faaa7_caseD_8814:
      kVar4 = 4;
      kVar5 = 0x1406;
      break;
    case 0x8231:
    case 0x8237:
switchD_001faae1_caseD_8d8e:
      kVar5 = 0x1400;
      break;
    case 0x8233:
    case 0x8239:
switchD_001faae1_caseD_8d88:
      kVar4 = 2;
      kVar5 = 0x1402;
      break;
    case 0x8235:
    case 0x823b:
switchD_001faa2f_caseD_8d82:
      kVar4 = 4;
      kVar5 = 0x1404;
      break;
    case 0x8236:
    case 0x823c:
switchD_001faa2f_caseD_8d70:
      kVar4 = 4;
      kVar5 = 0x1405;
      break;
    default:
      switch(kVar1) {
      case 0x804f:
      case 0x8056:
switchD_001faa12_caseD_8b93:
        kVar4 = 2;
        kVar5 = 0x8033;
        break;
      case 0x8050:
      case 0x8057:
switchD_001faa12_caseD_8b94:
        kVar4 = 2;
        kVar5 = 0x8034;
        break;
      case 0x8051:
      case 0x8055:
      case 0x8058:
        break;
      case 0x8052:
        kVar4 = 4;
        kVar5 = 0x8036;
        break;
      case 0x8053:
      case 0x8054:
      case 0x805a:
      case 0x805b:
        goto switchD_001faa2f_caseD_8d76;
      case 0x8059:
switchD_001fa9f5_caseD_8059:
        kVar4 = 4;
        kVar5 = 0x8368;
        break;
      default:
        switch(kVar1) {
        case 0x8b90:
        case 0x8b91:
        case 0x8b95:
        case 0x8b96:
          break;
        case 0x8b92:
        case 0x8b97:
switchD_001faa12_caseD_8b92:
          kVar4 = 2;
          kVar5 = 0x8363;
          break;
        case 0x8b93:
        case 0x8b98:
          goto switchD_001faa12_caseD_8b93;
        case 0x8b94:
        case 0x8b99:
          goto switchD_001faa12_caseD_8b94;
        default:
          if (kVar1 - 0x9270 < 10) break;
          uVar6 = (ulong)(kVar1 - 0x8c70);
          if (kVar1 - 0x8c70 < 0x3e) {
            if ((0xc0000000fU >> (uVar6 & 0x3f) & 1) == 0) {
              if (uVar6 == 0x3c) goto switchD_001faaa7_caseD_8814;
              if (uVar6 != 0x3d) goto LAB_001faa21;
LAB_001faa6f:
              kVar4 = 4;
              kVar5 = 0x8dad;
            }
            break;
          }
LAB_001faa21:
          switch(kVar1) {
          case 0x8d70:
          case 0x8d71:
            goto switchD_001faa2f_caseD_8d70;
          case 0x8d72:
          case 0x8d73:
          case 0x8d74:
          case 0x8d75:
          case 0x8d78:
          case 0x8d79:
          case 0x8d7a:
          case 0x8d7b:
          case 0x8d7e:
          case 0x8d7f:
          case 0x8d80:
          case 0x8d81:
            goto switchD_001faae1_caseD_8d8a;
          case 0x8d76:
          case 0x8d77:
            goto switchD_001faa2f_caseD_8d76;
          case 0x8d7c:
          case 0x8d7d:
            goto switchD_001faac4_caseD_8c41;
          case 0x8d82:
          case 0x8d83:
            goto switchD_001faa2f_caseD_8d82;
          default:
            switch(kVar1) {
            case 0x8f94:
            case 0x8f95:
            case 0x8f96:
            case 0x8f97:
              goto switchD_001faae1_caseD_8d8e;
            case 0x8f98:
            case 0x8f99:
            case 0x8f9a:
            case 0x8f9b:
              goto switchD_001faae1_caseD_8d88;
            }
            if (kVar1 - 0x83f0 < 4) goto switchD_001faac4_caseD_8c41;
            switch(kVar1) {
            case 0x8814:
            case 0x8815:
              goto switchD_001faaa7_caseD_8814;
            case 0x8816:
            case 0x8817:
            case 0x8818:
            case 0x8819:
switchD_001faae1_caseD_8d8a:
              This->glType = 0x501;
              kVar2 = KTX_INVALID_VALUE;
              break;
            case 0x881a:
            case 0x881b:
              goto switchD_001faaa7_caseD_881a;
            default:
              if ((3 < kVar1 - 0x8a54) && (3 < kVar1 - 0x8c00)) {
                switch(kVar1) {
                case 0x8c3a:
                  kVar4 = 4;
                  kVar5 = 0x8c3b;
                  break;
                case 0x8c3b:
                case 0x8c3c:
                case 0x8c3e:
                case 0x8c3f:
                case 0x8c40:
                case 0x8c42:
                  goto switchD_001faae1_caseD_8d8a;
                case 0x8c3d:
                  kVar4 = 4;
                  kVar5 = 0x8c3e;
                  break;
                case 0x8c41:
                case 0x8c43:
                  break;
                default:
                  if (3 < kVar1 - 0x8c4c) {
                    switch(kVar1) {
                    case 0x8d88:
                    case 0x8d89:
                      goto switchD_001faae1_caseD_8d88;
                    case 0x8d8a:
                    case 0x8d8b:
                    case 0x8d8c:
                    case 0x8d8d:
                      goto switchD_001faae1_caseD_8d8a;
                    case 0x8d8e:
                    case 0x8d8f:
                      goto switchD_001faae1_caseD_8d8e;
                    default:
                      if ((((3 < kVar1 - 0x8dbb) && (2 < kVar1 - 0x8d46)) && (1 < kVar1 - 0x8e8c))
                         && ((1 < kVar1 - 0x8fbd && (1 < kVar1 - 0x9137)))) {
                        if (kVar1 == 0x2a10) {
                          kVar5 = 0x8362;
                        }
                        else {
                          if (kVar1 == 0x81a5) goto switchD_001faa2f_caseD_8d76;
                          if (kVar1 == 0x81a6) {
LAB_001fab2e:
                            kVar4 = 4;
                            kVar5 = 0x84fa;
                          }
                          else {
                            if (kVar1 == 0x81a7) goto switchD_001faa2f_caseD_8d70;
                            if (kVar1 != 0x87ee) {
                              if (kVar1 == 0x88f0) goto LAB_001fab2e;
                              if (kVar1 == 0x8d49) goto switchD_001faa2f_caseD_8d76;
                              if (kVar1 == 0x8d62) goto switchD_001faa12_caseD_8b92;
                              if (kVar1 != 0x8d64) {
                                if (kVar1 != 0x8dab) {
                                  if (kVar1 == 0x8dac) goto LAB_001faa6f;
                                  if ((kVar1 != 0x8e8e) && (kVar1 != 0x8e8f)) {
                                    if (kVar1 == 0x906f) goto switchD_001fa9f5_caseD_8059;
                                    goto switchD_001faae1_caseD_8d8a;
                                  }
                                }
                                goto switchD_001faaa7_caseD_8814;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              goto switchD_001faac4_caseD_8c41;
            }
          }
          goto LAB_001fa9b3;
        }
      }
    }
switchD_001faac4_caseD_8c41:
    This->glType = kVar5;
    This->_protected->_typeSize = kVar4;
    if (storageAllocation == KTX_TEXTURE_CREATE_ALLOC_STORAGE) {
      __size = ktxTexture_calcDataSizeTexture((ktxTexture *)This);
      This->dataSize = __size;
      pkVar3 = (ktx_uint8_t *)malloc(__size);
      This->pData = pkVar3;
      if (pkVar3 == (ktx_uint8_t *)0x0) {
        kVar2 = KTX_OUT_OF_MEMORY;
LAB_001fa9b3:
        ktxTexture1_destruct(This);
        ktxTexture_destruct((ktxTexture *)This);
        goto switchD_001fa698_caseD_8d8a;
      }
    }
    *newTex = This;
    kVar2 = KTX_SUCCESS;
  }
  else {
switchD_001fa698_caseD_8d8a:
    free(This);
  }
  return kVar2;
}

Assistant:

KTX_error_code
ktxTexture1_Create(const ktxTextureCreateInfo* const createInfo,
                   ktxTextureCreateStorageEnum storageAllocation,
                   ktxTexture1** newTex)
{
    KTX_error_code result;

    if (newTex == NULL)
        return KTX_INVALID_VALUE;

    ktxTexture1* tex = (ktxTexture1*)malloc(sizeof(ktxTexture1));
    if (tex == NULL)
        return KTX_OUT_OF_MEMORY;

    result = ktxTexture1_construct(tex, createInfo, storageAllocation);
    if (result != KTX_SUCCESS) {
        free(tex);
    } else {
        *newTex = tex;
    }
    return result;
}